

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

string * __thiscall
cmOSXBundleGenerator::InitMacOSXContentDirectory
          (string *__return_storage_ptr__,cmOSXBundleGenerator *this,char *pkgloc,string *config)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  size_t local_88;
  char *local_80;
  string local_78;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  
  cmGeneratorTarget::GetMacContentDirectory(&local_78,this->GT,config,RuntimeBinaryArtifact);
  local_58 = (undefined1 *)0x1;
  local_48 = 0x2f;
  local_a8._M_dataplus._M_p = (pointer)local_78._M_string_length;
  local_a8._M_string_length = (size_type)local_78._M_dataplus._M_p;
  local_a8.field_2._M_allocated_capacity = 1;
  local_a8.field_2._8_8_ = &local_48;
  local_50 = &local_48;
  local_88 = strlen(pkgloc);
  views._M_len = 3;
  views._M_array = (iterator)&local_a8;
  local_80 = pkgloc;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,pkgloc,(allocator<char> *)&local_58);
  std::__cxx11::string::find((char)&local_a8,0x2f);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_a8);
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this->MacContentFolders,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOSXBundleGenerator::InitMacOSXContentDirectory(
  const char* pkgloc, const std::string& config)
{
  // Construct the full path to the content subdirectory.

  std::string macdir = cmStrCat(this->GT->GetMacContentDirectory(
                                  config, cmStateEnums::RuntimeBinaryArtifact),
                                '/', pkgloc);
  cmSystemTools::MakeDirectory(macdir);

  // Record use of this content location.  Only the first level
  // directory is needed.
  {
    std::string loc = pkgloc;
    loc = loc.substr(0, loc.find('/'));
    this->MacContentFolders->insert(loc);
  }

  return macdir;
}